

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_ObjConnect(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFan0,Aig_Obj_t *pFan1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pFan1_local;
  Aig_Obj_t *pFan0_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigObj.c"
                  ,0x80,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsCi(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigObj.c"
                  ,0x81,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pObj->pFanin0 = pFan0;
  pObj->pFanin1 = pFan1;
  if (pFan0 != (Aig_Obj_t *)0x0) {
    pAVar4 = Aig_ObjFanin0(pObj);
    if ((*(ulong *)&pAVar4->field_0x18 & 7) == 0) {
      __assert_fail("Aig_ObjFanin0(pObj)->Type > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigObj.c"
                    ,0x88,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)")
      ;
    }
    pAVar4 = Aig_ObjFanin0(pObj);
    Aig_ObjRef(pAVar4);
    if (p->pFanData != (int *)0x0) {
      pAVar4 = Aig_ObjFanin0(pObj);
      Aig_ObjAddFanout(p,pAVar4,pObj);
    }
  }
  if (pFan1 != (Aig_Obj_t *)0x0) {
    pAVar4 = Aig_ObjFanin1(pObj);
    if ((*(ulong *)&pAVar4->field_0x18 & 7) == 0) {
      __assert_fail("Aig_ObjFanin1(pObj)->Type > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigObj.c"
                    ,0x8f,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)")
      ;
    }
    pAVar4 = Aig_ObjFanin1(pObj);
    Aig_ObjRef(pAVar4);
    if (p->pFanData != (int *)0x0) {
      pAVar4 = Aig_ObjFanin1(pObj);
      Aig_ObjAddFanout(p,pAVar4,pObj);
    }
  }
  uVar2 = Aig_ObjLevelNew(pObj);
  *(ulong *)&pObj->field_0x18 =
       *(ulong *)&pObj->field_0x18 & 0xff000000ffffffff | ((ulong)uVar2 & 0xffffff) << 0x20;
  uVar2 = Aig_ObjPhaseReal(pFan0);
  uVar3 = Aig_ObjPhaseReal(pFan1);
  *(ulong *)&pObj->field_0x18 =
       *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff7 | ((ulong)(uVar2 & uVar3) & 1) << 3;
  if ((p->pTable != (Aig_Obj_t **)0x0) && (iVar1 = Aig_ObjIsHash(pObj), iVar1 != 0)) {
    Aig_TableInsert(p,pObj);
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if ((iVar1 != 0) && ((*(ulong *)&pObj->field_0x18 >> 0x20 & 0xffffff) == 0)) {
    __assert_fail("!Aig_ObjIsNode(pObj) || pObj->Level > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigObj.c"
                  ,0x9d,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  return;
}

Assistant:

void Aig_ObjConnect( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFan0, Aig_Obj_t * pFan1 )
{
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCi(pObj) );
    // add the first fanin
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    // increment references of the fanins and add their fanouts
    if ( pFan0 != NULL )
    {
        assert( Aig_ObjFanin0(pObj)->Type > 0 );
        Aig_ObjRef( Aig_ObjFanin0(pObj) );
        if ( p->pFanData )
            Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
    }
    if ( pFan1 != NULL )
    {
        assert( Aig_ObjFanin1(pObj)->Type > 0 );
        Aig_ObjRef( Aig_ObjFanin1(pObj) );
        if ( p->pFanData )
            Aig_ObjAddFanout( p, Aig_ObjFanin1(pObj), pObj );
    }
    // set level and phase
    pObj->Level = Aig_ObjLevelNew( pObj );
    pObj->fPhase = Aig_ObjPhaseReal(pFan0) & Aig_ObjPhaseReal(pFan1);
    // add the node to the structural hash table
    if ( p->pTable && Aig_ObjIsHash(pObj) )
        Aig_TableInsert( p, pObj );
    // add the node to the dynamically updated topological order
//    if ( p->pOrderData && Aig_ObjIsNode(pObj) )
//        Aig_ObjOrderInsert( p, pObj->Id );
    assert( !Aig_ObjIsNode(pObj) || pObj->Level > 0 );
}